

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O0

string * str::join<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                   (string_view delimiter,
                   set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *container
                   )

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  iterator this;
  string *in_RDI;
  ostringstream stream;
  iterator it;
  LinkedToken *in_stack_fffffffffffffdd8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffde0;
  _Rb_tree_const_iterator<LinkedToken> *in_stack_fffffffffffffde8;
  ostringstream *this_00;
  allocator<char> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  _Self local_1d8;
  _Base_ptr local_1d0;
  ostringstream local_1c8 [376];
  _Self local_50 [3];
  allocator<char> local_31;
  _Self local_30;
  _Self local_28 [5];
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::begin<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                 ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                  in_stack_fffffffffffffdd8);
  local_30._M_node =
       (_Base_ptr)
       std::end<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                 ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                  in_stack_fffffffffffffdd8);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    local_50[0]._M_node =
         (_Base_ptr)
         std::begin<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                   ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                    in_stack_fffffffffffffdd8);
    this_00 = local_1c8;
    std::__cxx11::ostringstream::ostringstream(this_00);
    local_1d0 = (_Base_ptr)
                std::_Rb_tree_const_iterator<LinkedToken>::operator++
                          (in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20)
                          );
    std::_Rb_tree_const_iterator<LinkedToken>::operator*
              ((_Rb_tree_const_iterator<LinkedToken> *)0x119ddd);
    operator<<(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    while( true ) {
      this = std::end<std::set<LinkedToken,std::less<LinkedToken>,std::allocator<LinkedToken>>>
                       ((set<LinkedToken,_std::less<LinkedToken>,_std::allocator<LinkedToken>_> *)
                        in_stack_fffffffffffffdd8);
      local_1d8._M_node = this._M_node;
      bVar1 = std::operator!=(local_50,&local_1d8);
      if (!bVar1) break;
      __str._M_str = (char *)this_00;
      __str._M_len = (size_t)this._M_node;
      in_stack_fffffffffffffde0 = std::operator<<(in_stack_fffffffffffffde0,__str);
      std::_Rb_tree_const_iterator<LinkedToken>::operator++
                ((_Rb_tree_const_iterator<LinkedToken> *)this._M_node,
                 (int)((ulong)in_stack_fffffffffffffde0 >> 0x20));
      std::_Rb_tree_const_iterator<LinkedToken>::operator*
                ((_Rb_tree_const_iterator<LinkedToken> *)0x119e6a);
      operator<<(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  return in_RDI;
}

Assistant:

std::string join(std::string_view delimiter, const Container& container) {
        if (std::begin(container) == std::end(container)) {
            return "";
        }

        auto it = std::begin(container);
        std::ostringstream stream;
        stream << *it++;
        while (it != std::end(container)) {
            stream << delimiter << *it++;
        }

        return stream.str();
    }